

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimeCorrFunc.cpp
# Opt level: O3

void __thiscall
OpenMD::TimeCorrFunc<OpenMD::Vector<double,_4U>_>::correlateFrames
          (TimeCorrFunc<OpenMD::Vector<double,_4U>_> *this,int frame1,int frame2,int timeBin)

{
  double *pdVar1;
  int *piVar2;
  pointer pVVar3;
  pointer pvVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  double dVar7;
  pointer pvVar8;
  long lVar9;
  long lVar10;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *pvVar11;
  pointer piVar12;
  pointer piVar13;
  vector<int,_std::allocator<int>_> s1;
  vector<int,_std::allocator<int>_> s2;
  vector<int,_std::allocator<int>_> local_c8;
  vector<int,_std::allocator<int>_> local_a8;
  double local_88 [5];
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  long local_48;
  long local_40;
  long local_38;
  
  local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (int *)0x0;
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_88[2] = 0.0;
  local_88[3] = 0.0;
  local_88[0] = 0.0;
  local_88[1] = 0.0;
  if (this->doSystemProperties_ == true) {
    (*(this->super_DynamicProperty)._vptr_DynamicProperty[0xc])
              (local_88 + 4,this,(ulong)(uint)frame1,(ulong)(uint)frame2);
    local_88[2] = (double)local_58;
    local_88[3] = (double)uStack_50;
    local_88[0] = local_88[4];
    local_88[1] = (double)uStack_60;
    pVVar3 = (this->histogram_).
             super__Vector_base<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    lVar10 = 0;
    do {
      pdVar1 = pVVar3[timeBin].data_ + lVar10;
      dVar7 = pdVar1[1] + local_88[lVar10 + 1];
      auVar5._8_4_ = SUB84(dVar7,0);
      auVar5._0_8_ = *pdVar1 + local_88[lVar10];
      auVar5._12_4_ = (int)((ulong)dVar7 >> 0x20);
      *(undefined1 (*) [16])(pVVar3[timeBin].data_ + lVar10) = auVar5;
      lVar10 = lVar10 + 2;
    } while (lVar10 != 4);
    piVar2 = (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_start + timeBin;
    *piVar2 = *piVar2 + 1;
  }
  else {
    local_40 = (long)frame1 * 3;
    std::vector<int,_std::allocator<int>_>::operator=
              (&local_c8,
               (this->sele1ToIndex_).
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start + frame1);
    pvVar11 = &this->sele1ToIndex_;
    if (this->uniqueSelections_ != false) {
      pvVar11 = &this->sele2ToIndex_;
    }
    local_48 = (long)frame2 * 3;
    std::vector<int,_std::allocator<int>_>::operator=
              (&local_a8,
               (pvVar11->
               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start + frame2);
    if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start !=
        local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish) {
      lVar10 = (long)timeBin;
      piVar12 = local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      piVar13 = local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start;
      local_38 = lVar10;
      while (piVar13 !=
             local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish) {
        if (piVar12 !=
            local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish) {
          do {
            if (*piVar13 <= *piVar12) break;
            piVar12 = piVar12 + 1;
          } while (piVar12 !=
                   local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish);
        }
        do {
          if (*piVar12 <= *piVar13) break;
          piVar13 = piVar13 + 1;
        } while (piVar13 !=
                 local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish);
        if ((piVar12 ==
             local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_finish) ||
           (piVar13 ==
            local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish)) break;
        if ((this->super_DynamicProperty).selectionModeRestart_ == true) {
          pvVar4 = (this->selection1StartFrame_).
                   super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pvVar8 = pvVar4;
          if (this->uniqueSelections_ != false) {
            pvVar8 = (this->selection2StartFrame_).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          }
          if (*(int *)((long)(&(pvVar4->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start)[local_40] +
                      ((long)piVar12 -
                      (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start)) !=
              *(int *)((long)(&(pvVar8->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_start)[local_48] +
                      ((long)piVar13 -
                      (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start))) break;
          (*(this->super_DynamicProperty)._vptr_DynamicProperty[0x13])
                    (local_88 + 4,this,(ulong)(uint)frame1,(ulong)(uint)frame2,
                     (ulong)((long)piVar12 -
                            (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 2,
                     (ulong)((long)piVar13 -
                            (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 2);
        }
        else {
          (*(this->super_DynamicProperty)._vptr_DynamicProperty[0x13])
                    (local_88 + 4,this,(ulong)(uint)frame1,(ulong)(uint)frame2,
                     (ulong)((long)piVar12 -
                            (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 2,
                     (ulong)((long)piVar13 -
                            (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start) >> 2);
        }
        local_88[2] = (double)local_58;
        local_88[3] = (double)uStack_50;
        local_88[0] = local_88[4];
        local_88[1] = (double)uStack_60;
        pVVar3 = (this->histogram_).
                 super__Vector_base<OpenMD::Vector<double,_4U>,_std::allocator<OpenMD::Vector<double,_4U>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar9 = 0;
        do {
          pdVar1 = pVVar3[lVar10].data_ + lVar9;
          dVar7 = pdVar1[1] + local_88[lVar9 + 1];
          auVar6._8_4_ = SUB84(dVar7,0);
          auVar6._0_8_ = *pdVar1 + local_88[lVar9];
          auVar6._12_4_ = (int)((ulong)dVar7 >> 0x20);
          *(undefined1 (*) [16])(pVVar3[lVar10].data_ + lVar9) = auVar6;
          lVar9 = lVar9 + 2;
        } while (lVar9 != 4);
        piVar2 = (this->count_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start + local_38;
        *piVar2 = *piVar2 + 1;
        piVar12 = piVar12 + 1;
        piVar13 = piVar13 + 1;
        if (piVar12 ==
            local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish) break;
      }
    }
  }
  if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_c8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void TimeCorrFunc<T>::correlateFrames(int frame1, int frame2, int timeBin) {
    std::vector<int> s1;
    std::vector<int> s2;

    std::vector<int>::iterator i1;
    std::vector<int>::iterator i2;

    T corrVal(0.0);
    T zeroType(0.0);

    if (doSystemProperties_) {
      corrVal = calcCorrVal(frame1, frame2);
      histogram_[timeBin] += corrVal;
      count_[timeBin]++;

    } else {
      s1 = sele1ToIndex_[frame1];

      if (uniqueSelections_)
        s2 = sele2ToIndex_[frame2];
      else
        s2 = sele1ToIndex_[frame2];

      for (i1 = s1.begin(), i2 = s2.begin(); i1 != s1.end() && i2 != s2.end();
           ++i1, ++i2) {
        // If the selections are dynamic, they might not have the
        // same objects in both frames, so we need to roll either of
        // the selections until we have the same object to
        // correlate.

        while (i1 != s1.end() && *i1 < *i2) {
          ++i1;
        }

        while (i2 != s2.end() && *i2 < *i1) {
          ++i2;
        }

        if (i1 == s1.end() || i2 == s2.end()) break;

	if (selectionModeRestart_) {
	  
	  int ssf1 = selection1StartFrame_[frame1][i1 - s1.begin()];
	  int ssf2 = uniqueSelections_ ?
	    selection2StartFrame_[frame2][i2 - s2.begin()] :
	    selection1StartFrame_[frame2][i2 - s2.begin()];


	  if (ssf1 != ssf2) break;
	  corrVal = calcCorrVal(frame1, frame2,
				i1 - s1.begin(), i2 - s2.begin());	  
	} else {
	  
	  corrVal = calcCorrVal(frame1, frame2,
				i1 - s1.begin(), i2 - s2.begin());        
	}
        histogram_[timeBin] += corrVal;
        count_[timeBin]++;
      }
    }
  }